

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ResupplyOfferPdu.cpp
# Opt level: O2

void __thiscall DIS::ResupplyOfferPdu::~ResupplyOfferPdu(ResupplyOfferPdu *this)

{
  (this->super_LogisticsFamilyPdu).super_Pdu.super_PduSuperclass._vptr_PduSuperclass =
       (_func_int **)&PTR__ResupplyOfferPdu_001c2d00;
  std::vector<DIS::SupplyQuantity,_std::allocator<DIS::SupplyQuantity>_>::clear(&this->_supplies);
  std::vector<DIS::SupplyQuantity,_std::allocator<DIS::SupplyQuantity>_>::~vector(&this->_supplies);
  EntityID::~EntityID(&this->_supplyingEntityID);
  EntityID::~EntityID(&this->_receivingEntityID);
  LogisticsFamilyPdu::~LogisticsFamilyPdu(&this->super_LogisticsFamilyPdu);
  return;
}

Assistant:

ResupplyOfferPdu::~ResupplyOfferPdu()
{
    _supplies.clear();
}